

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

vector<picnic_params_t,_std::allocator<picnic_params_t>_> * all_supported_parameters(void)

{
  iterator __position;
  undefined8 in_RAX;
  long lVar1;
  vector<picnic_params_t,std::allocator<picnic_params_t>> *in_RDI;
  long lVar2;
  picnic_params_t_conflict param;
  undefined8 uStack_28;
  
  lVar2 = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  uStack_28 = in_RAX;
  do {
    uStack_28 = CONCAT44(*(undefined4 *)((long)&(anonymous_namespace)::all_parameters + lVar2),
                         (undefined4)uStack_28);
    lVar1 = picnic_signature_size();
    if (lVar1 != 0) {
      __position._M_current = *(anon_enum_32 **)(in_RDI + 8);
      if (__position._M_current == *(anon_enum_32 **)(in_RDI + 0x10)) {
        std::vector<picnic_params_t,std::allocator<picnic_params_t>>::
        _M_realloc_insert<picnic_params_t_const&>
                  (in_RDI,__position,(anon_enum_32 *)((long)&uStack_28 + 4));
      }
      else {
        *__position._M_current = uStack_28._4_4_;
        *(anon_enum_32 **)(in_RDI + 8) = __position._M_current + 1;
      }
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x30);
  return (vector<picnic_params_t,_std::allocator<picnic_params_t>_> *)in_RDI;
}

Assistant:

std::vector<picnic_params_t> all_supported_parameters() {
  std::vector<picnic_params_t> res;
  for (const auto param : all_parameters) {
    if (picnic_signature_size(param)) {
      res.push_back(param);
    }
  }
  return res;
}